

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

size_t absl::lts_20250127::str_format_internal::(anonymous_namespace)::
       PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                 (unsigned_long digits,Buffer *out)

{
  char cVar1;
  Buffer *pBVar2;
  bool bVar3;
  size_t sVar4;
  
  if (digits == 0) {
    sVar4 = 0;
  }
  else {
    do {
      pBVar2 = (Buffer *)out->begin;
      if (pBVar2 <= out) goto LAB_0034d54e;
      out->begin = (char *)((long)&pBVar2[-1].end + 7);
      *(byte *)((long)&pBVar2[-1].end + 7) = (char)digits + (char)(digits / 10) * -10 | 0x30;
      bVar3 = 9 < digits;
      digits = digits / 10;
    } while (bVar3);
    pBVar2 = (Buffer *)out->begin;
    if (pBVar2 <= out) {
LAB_0034d54e:
      __assert_fail("begin > data",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                    ,0x3ef,
                    "void absl::str_format_internal::(anonymous namespace)::Buffer::push_front(char)"
                   );
    }
    cVar1 = pBVar2->data[0];
    sVar4 = (long)out->end - (long)pBVar2;
    out->begin = (char *)((long)&pBVar2[-1].end + 7);
    *(char *)((long)&pBVar2[-1].end + 7) = cVar1;
    out->begin[1] = '.';
  }
  return sVar4;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}